

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  undefined8 this_00;
  bool bVar1;
  value_type this_01;
  FieldGenerator *this_02;
  undefined1 in_R8B;
  Iterator IVar2;
  string_view sVar3;
  Iterator IVar4;
  string_view input;
  string_view s;
  string_view s_00;
  Sub *local_2c0;
  string local_280;
  string_view local_260;
  string local_250;
  string_view local_230;
  string local_220;
  value_type_conflict local_200;
  value_type_conflict field;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  string_view local_1c0 [2];
  allocator<char> local_199;
  string local_198;
  Sub *local_178;
  Sub local_170;
  iterator local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  undefined1 local_98 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Formatter format;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  undefined8 uStack_18;
  int i;
  Printer *p_local;
  MessageGenerator *this_local;
  
  __range3._4_4_ = 0;
  uStack_18 = p;
  p_local = (Printer *)this;
  __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
  IVar2 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
  __begin3._0_8_ = IVar2.descriptor;
  __end3.descriptor._0_4_ = IVar2.idx;
  IVar2 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
  __end3._0_8_ = IVar2.descriptor;
  oneof._0_4_ = IVar2.idx;
  while( true ) {
    bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof);
    if (!bVar1) break;
    this_01 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
    Formatter::Formatter((Formatter *)(v.storage_.callback_buffer_ + 8),(Printer *)uStack_18);
    this_00 = uStack_18;
    local_178 = &local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"oneofname",&local_199);
    sVar3 = OneofDescriptor::name(this_01);
    local_1c0[0] = sVar3;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (&local_170,&local_198,local_1c0);
    local_b8 = &local_170;
    local_b0 = 1;
    v_00._M_len = 1;
    v_00._M_array = local_b8;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_a8._M_local_buf,v_00);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_98,(Printer *)this_00,
               (Span<const_google::protobuf::io::Printer::Sub>)local_a8);
    local_2c0 = (Sub *)&local_b8;
    do {
      local_2c0 = local_2c0 + -1;
      io::Printer::Sub::~Sub(local_2c0);
    } while (local_2c0 != &local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"switch ($oneofname$_case()) {\n");
    Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
    __begin4.descriptor =
         (OneofDescriptor *)
         protobuf::internal::FieldRange<google::protobuf::OneofDescriptor>(this_01);
    IVar4 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __begin4._0_8_ = IVar4.descriptor;
    __end4.descriptor._0_4_ = IVar4.idx;
    IVar4 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __end4._0_8_ = IVar4.descriptor;
    field._0_4_ = IVar4.idx;
    while( true ) {
      bVar1 = protobuf::internal::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&field);
      if (!bVar1) break;
      local_200 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
                  operator*((Iterator *)&__end4.descriptor);
      sVar3 = FieldDescriptor::name(local_200);
      input._M_len = sVar3._M_str;
      input._M_str = (char *)0x1;
      local_230 = sVar3;
      UnderscoresToCamelCase_abi_cxx11_(&local_220,(cpp *)sVar3._M_len,input,(bool)in_R8B);
      Formatter::operator()
                ((Formatter *)(v.storage_.callback_buffer_ + 8),"case k$1$: {\n",&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
      bVar1 = IsStringOrMessage(local_200);
      if (bVar1) {
        this_02 = FieldGeneratorTable::get(&this->field_generators_,local_200);
        FieldGenerator::GenerateClearingCode(this_02,(Printer *)uStack_18);
      }
      else {
        Formatter::operator()<>
                  ((Formatter *)(v.storage_.callback_buffer_ + 8),"// No need to clear\n");
      }
      Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"break;\n");
      Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
      Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"}\n");
      protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                ((Iterator *)&__end4.descriptor);
    }
    sVar3 = OneofDescriptor::name(this_01);
    s._M_len = sVar3._M_str;
    s._M_str = (char *)sVar3._M_len;
    local_260 = sVar3;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_250,(lts_20250127 *)sVar3._M_len,s);
    Formatter::operator()
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"case $1$_NOT_SET: {\n  break;\n}\n",
               &local_250);
    std::__cxx11::string::~string((string *)&local_250);
    Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
    sVar3 = OneofDescriptor::name(this_01);
    s_00._M_len = sVar3._M_str;
    s_00._M_str = (char *)sVar3._M_len;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_280,(lts_20250127 *)sVar3._M_len,s_00);
    Formatter::operator()
              ((Formatter *)(v.storage_.callback_buffer_ + 8),
               "}\n$oneof_case$[$1$] = $2$_NOT_SET;\n",(int *)((long)&__range3 + 4),&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
    Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"}\n\n");
    __range3._4_4_ = __range3._4_4_ + 1;
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_98);
    Formatter::~Formatter((Formatter *)(v.storage_.callback_buffer_ + 8));
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* p) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(p);
    auto v = p->WithVars({{"oneofname", oneof->name()}});

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("$pbi$::TSanWrite(&_impl_);\n");
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(p);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "$oneof_case$[$1$] = $2$_NOT_SET;\n",
        i, absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    ++i;
  }
}